

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O1

void dictionary_close(dictionary_t t_dictionary)

{
  char *pcVar1;
  char *__s1;
  long lVar2;
  int iVar3;
  long *t_dictionary_00;
  FILE *__stream;
  size_t __len;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  ssize_t sVar7;
  size_t *in_RCX;
  ulong uVar8;
  size_t maxlen;
  size_t *match_length;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ucs4_t *in_RSI;
  ulong uVar14;
  
  if (*t_dictionary == 1) {
    dictionary_datrie_close(*(dictionary_t *)((long)t_dictionary + 8));
LAB_00102744:
    free(t_dictionary);
    return;
  }
  if (*t_dictionary == 0) {
    dictionary_text_close(*(dictionary_t *)((long)t_dictionary + 8));
    goto LAB_00102744;
  }
  dictionary_close_cold_1();
  if (*t_dictionary == 1) {
    dictionary_datrie_match_longest(*(dictionary_t *)((long)t_dictionary + 8),in_RSI,maxlen,in_RCX);
    return;
  }
  if (*t_dictionary == 0) {
    dictionary_text_match_longest(*(dictionary_t *)((long)t_dictionary + 8),in_RSI,maxlen,in_RCX);
    return;
  }
  dictionary_match_longest_cold_1();
  if (*t_dictionary == 1) {
    dictionary_datrie_get_all_match_lengths
              (*(dictionary_t *)((long)t_dictionary + 8),in_RSI,match_length);
    return;
  }
  if (*t_dictionary == 0) {
    dictionary_text_get_all_match_lengths
              (*(dictionary_t *)((long)t_dictionary + 8),in_RSI,match_length);
    return;
  }
  dictionary_get_all_match_lengths_cold_1();
  t_dictionary_00 = (long *)malloc(0x40);
  *t_dictionary_00 = 0;
  t_dictionary_00[2] = 0;
  __stream = fopen((char *)t_dictionary,"rb");
  iVar3 = fileno(__stream);
  fseek(__stream,0,2);
  __len = ftell(__stream);
  t_dictionary_00[6] = __len;
  *(undefined4 *)(t_dictionary_00 + 7) = 0;
  pvVar4 = mmap((void *)0x0,__len,1,2,iVar3,0);
  pvVar5 = pvVar4;
  if (pvVar4 == (void *)0xffffffffffffffff) {
    pvVar5 = (void *)0x0;
  }
  t_dictionary_00[5] = (long)pvVar5;
  if (pvVar4 == (void *)0xffffffffffffffff) {
    *(undefined4 *)(t_dictionary_00 + 7) = 1;
    pvVar5 = malloc(__len);
    t_dictionary_00[5] = (long)pvVar5;
    if (pvVar5 == (void *)0x0) goto LAB_0010298e;
    lseek(iVar3,0,0);
    sVar7 = read(iVar3,pvVar5,__len);
    if (sVar7 == -1) goto LAB_0010298e;
  }
  __s1 = (char *)t_dictionary_00[5];
  iVar3 = strncmp(__s1,"OPENCCDATRIE",0xc);
  if (iVar3 == 0) {
    uVar13 = (ulong)*(uint *)(__s1 + 0xc);
    t_dictionary_00[2] = (long)(__s1 + 0x10);
    uVar8 = (ulong)*(uint *)(__s1 + uVar13 * 4 + 0x10);
    pcVar1 = __s1 + uVar8 * 4 + uVar13 * 4 + 0x1c;
    uVar12 = (ulong)*(uint *)(pcVar1 + -8);
    *(uint *)(t_dictionary_00 + 3) = *(uint *)(pcVar1 + -8);
    *(undefined4 *)(t_dictionary_00 + 1) = *(undefined4 *)(pcVar1 + -4);
    *t_dictionary_00 = (long)pcVar1;
    pvVar5 = malloc(uVar12 * 8);
    t_dictionary_00[4] = (long)pvVar5;
    if (uVar12 != 0) {
      lVar2 = uVar13 * 4 + 0x14;
      uVar13 = 0;
      uVar14 = 0;
      do {
        uVar10 = uVar13;
        uVar9 = uVar13;
        if (uVar13 < uVar8) {
          do {
            uVar10 = uVar9;
            if (*(int *)(__s1 + uVar9 * 4 + lVar2) == -1) break;
            uVar9 = uVar9 + 1;
            uVar10 = uVar8;
          } while (uVar8 != uVar9);
        }
        pvVar4 = malloc((uVar10 - uVar13) * 8 + 8);
        *(void **)((long)pvVar5 + uVar14 * 8) = pvVar4;
        lVar11 = uVar10 - uVar13;
        if (lVar11 == 0) {
          lVar6 = 0;
        }
        else {
          lVar6 = 0;
          do {
            *(char **)(*(long *)((long)pvVar5 + uVar14 * 8) + lVar6 * 8) =
                 __s1 + 0x10 + (ulong)*(uint *)(__s1 + lVar6 * 4 + uVar13 * 4 + lVar2) * 4;
            lVar6 = lVar6 + 1;
          } while (lVar11 != lVar6);
        }
        *(undefined8 *)(*(long *)((long)pvVar5 + uVar14 * 8) + lVar11 * 8) = 0;
        uVar13 = uVar13 + lVar6 + 1;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar12);
    }
    fclose(__stream);
    return;
  }
LAB_0010298e:
  dictionary_datrie_close(t_dictionary_00);
  return;
}

Assistant:

void dictionary_close(dictionary_t t_dictionary)
{
	dictionary_desc * dictionary = (dictionary_desc *) t_dictionary;
	switch (dictionary->type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		dictionary_text_close(dictionary->dict);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		dictionary_datrie_close(dictionary->dict);
		break;
	default:
		debug_should_not_be_here();
	}
	free(dictionary);
}